

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unixSleep(unqlite_vfs *NotUsed,int microseconds)

{
  uint __seconds;
  
  __seconds = (microseconds + 999999) / 1000000;
  sleep(__seconds);
  return __seconds * 1000000;
}

Assistant:

static int unixSleep(unqlite_vfs *NotUsed, int microseconds)
{
#if defined(HAVE_USLEEP) && HAVE_USLEEP
  usleep(microseconds);
  SXUNUSED(NotUsed);
  return microseconds;
#else
  int seconds = (microseconds+999999)/1000000;
  SXUNUSED(NotUsed);
  sleep(seconds);
  return seconds*1000000;
#endif
}